

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O0

int __thiscall BezierEase::init(BezierEase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  qsizetype qVar2;
  const_reference pQVar3;
  reference pdVar4;
  reference pSVar5;
  long in_FS_OFFSET;
  qreal qVar6;
  int i;
  QPointF *in_stack_fffffffffffffec8;
  QPointF *in_stack_fffffffffffffed0;
  QList<QPointF> *in_stack_fffffffffffffed8;
  int local_24;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QPointF>::constLast(in_stack_fffffffffffffed8);
  QPointF::QPointF(&local_18,1.0,1.0);
  bVar1 = ::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if (bVar1) {
    this->_init = true;
    qVar2 = QList<QPointF>::size(&(this->super_QEasingCurveFunction)._bezierCurves);
    this->_curveCount = (int)(qVar2 / 3);
    for (local_24 = 0; local_24 < this->_curveCount; local_24 = local_24 + 1) {
      pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                  (qsizetype)in_stack_fffffffffffffec8);
      qVar6 = QPointF::x(pQVar3);
      pdVar4 = QList<double>::operator[]
                         ((QList<double> *)in_stack_fffffffffffffed0,
                          (qsizetype)in_stack_fffffffffffffec8);
      *pdVar4 = qVar6;
      if (local_24 == 0) {
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p0x = 0.0;
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p0y = 0.0;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::x(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p1x = qVar6;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::y(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p1y = qVar6;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::x(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p2x = qVar6;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::y(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p2y = qVar6;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::x(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p3x = qVar6;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::y(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p3y = qVar6;
      }
      else if (local_24 == this->_curveCount + -1) {
        QList<QPointF>::size(&(this->super_QEasingCurveFunction)._bezierCurves);
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::x(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p0x = qVar6;
        QList<QPointF>::size(&(this->super_QEasingCurveFunction)._bezierCurves);
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::y(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p0y = qVar6;
        QList<QPointF>::size(&(this->super_QEasingCurveFunction)._bezierCurves);
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::x(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p1x = qVar6;
        QList<QPointF>::size(&(this->super_QEasingCurveFunction)._bezierCurves);
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::y(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p1y = qVar6;
        QList<QPointF>::size(&(this->super_QEasingCurveFunction)._bezierCurves);
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::x(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p2x = qVar6;
        QList<QPointF>::size(&(this->super_QEasingCurveFunction)._bezierCurves);
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::y(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p2y = qVar6;
        QList<QPointF>::size(&(this->super_QEasingCurveFunction)._bezierCurves);
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::x(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p3x = qVar6;
        QList<QPointF>::size(&(this->super_QEasingCurveFunction)._bezierCurves);
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::y(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p3y = qVar6;
      }
      else {
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        in_stack_fffffffffffffed0 = (QPointF *)QPointF::x(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p0x = (qreal)in_stack_fffffffffffffed0;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::y(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p0y = qVar6;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::x(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p1x = qVar6;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::y(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p1y = qVar6;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::x(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p2x = qVar6;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::y(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p2y = qVar6;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::x(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p3x = qVar6;
        pQVar3 = QList<QPointF>::at((QList<QPointF> *)in_stack_fffffffffffffed0,
                                    (qsizetype)in_stack_fffffffffffffec8);
        qVar6 = QPointF::y(pQVar3);
        pSVar5 = QList<BezierEase::SingleCubicBezier>::operator[]
                           ((QList<BezierEase::SingleCubicBezier> *)in_stack_fffffffffffffed0,
                            (qsizetype)in_stack_fffffffffffffec8);
        pSVar5->p3y = qVar6;
      }
    }
    this->_valid = true;
  }
  else {
    this->_valid = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void init()
    {
        if (_bezierCurves.constLast() == QPointF(1.0, 1.0)) {
            _init = true;
            _curveCount = _bezierCurves.size() / 3;

            for (int i=0; i < _curveCount; i++) {
                _intervals[i] = _bezierCurves.at(i * 3 + 2).x();

                if (i == 0) {
                    _curves[0].p0x = 0.0;
                    _curves[0].p0y = 0.0;

                    _curves[0].p1x = _bezierCurves.at(0).x();
                    _curves[0].p1y = _bezierCurves.at(0).y();

                    _curves[0].p2x = _bezierCurves.at(1).x();
                    _curves[0].p2y = _bezierCurves.at(1).y();

                    _curves[0].p3x = _bezierCurves.at(2).x();
                    _curves[0].p3y = _bezierCurves.at(2).y();

                } else if (i == (_curveCount - 1)) {
                    _curves[i].p0x = _bezierCurves.at(_bezierCurves.size() - 4).x();
                    _curves[i].p0y = _bezierCurves.at(_bezierCurves.size() - 4).y();

                    _curves[i].p1x = _bezierCurves.at(_bezierCurves.size() - 3).x();
                    _curves[i].p1y = _bezierCurves.at(_bezierCurves.size() - 3).y();

                    _curves[i].p2x = _bezierCurves.at(_bezierCurves.size() - 2).x();
                    _curves[i].p2y = _bezierCurves.at(_bezierCurves.size() - 2).y();

                    _curves[i].p3x = _bezierCurves.at(_bezierCurves.size() - 1).x();
                    _curves[i].p3y = _bezierCurves.at(_bezierCurves.size() - 1).y();
                } else {
                    _curves[i].p0x = _bezierCurves.at(i * 3 - 1).x();
                    _curves[i].p0y = _bezierCurves.at(i * 3 - 1).y();

                    _curves[i].p1x = _bezierCurves.at(i * 3).x();
                    _curves[i].p1y = _bezierCurves.at(i * 3).y();

                    _curves[i].p2x = _bezierCurves.at(i * 3 + 1).x();
                    _curves[i].p2y = _bezierCurves.at(i * 3 + 1).y();

                    _curves[i].p3x = _bezierCurves.at(i * 3 + 2).x();
                    _curves[i].p3y = _bezierCurves.at(i * 3 + 2).y();
                }
            }
            _valid = true;
        } else {
            _valid = false;
        }
    }